

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcRefactor.c
# Opt level: O3

Dec_Graph_t *
Abc_NodeRefactor(Abc_ManRef_t *p,Abc_Obj_t *pNode,Vec_Ptr_t *vFanins,int fUpdateLevel,int fUseZeros,
                int fUseDcs,int fVerbose)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  void **ppvVar7;
  Abc_Ntk_t *pAVar8;
  void *pvVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  word *pTruth;
  ulong uVar13;
  Dec_Graph_t *pDVar14;
  Kit_Graph_t *pGraph;
  int *piVar15;
  long lVar16;
  long lVar17;
  int nWords;
  uint uVar18;
  ulong uVar19;
  timespec local_58;
  int local_44;
  Abc_Obj_t *local_40;
  int local_34;
  
  iVar12 = vFanins->nSize;
  iVar11 = 1 << ((char)p->nNodeSizeMax - 6U & 0x1f);
  if (p->nNodeSizeMax < 7) {
    iVar11 = 1;
  }
  p->nNodesConsidered = p->nNodesConsidered + 1;
  if (fUpdateLevel == 0) {
    local_44 = 1000000000;
  }
  else {
    local_44 = Abc_ObjRequiredLevel(pNode);
  }
  local_40 = pNode;
  iVar10 = clock_gettime(3,&local_58);
  if (iVar10 < 0) {
    lVar16 = 1;
  }
  else {
    lVar16 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_58.tv_nsec),8);
    lVar16 = ((lVar16 >> 7) - (lVar16 >> 0x3f)) + local_58.tv_sec * -1000000;
  }
  pTruth = Abc_NodeConeTruth(p->vVars,p->vFuncs,iVar11,local_40,vFanins,p->vVisited);
  iVar11 = clock_gettime(3,&local_58);
  if (iVar11 < 0) {
    lVar17 = -1;
  }
  else {
    lVar17 = local_58.tv_nsec / 1000 + local_58.tv_sec * 1000000;
  }
  p->timeTru = p->timeTru + lVar17 + lVar16;
  if (pTruth == (word *)0x0) {
    return (Dec_Graph_t *)0x0;
  }
  uVar18 = 1 << ((char)iVar12 - 6U & 0x1f);
  if (iVar12 < 7) {
    uVar18 = 1;
  }
  local_34 = fUseZeros;
  if ((int)uVar18 < 1) {
    iVar12 = Abc_NodeMffcSize(local_40);
    p->nLastGain = iVar12;
    uVar1 = p->nNodesRefactored;
    uVar4 = p->nNodesGained;
    p->nNodesRefactored = uVar1 + 1;
    p->nNodesGained = iVar12 + uVar4;
LAB_002ff228:
    pDVar14 = (Dec_Graph_t *)calloc(1,0x20);
    pDVar14->fConst = 1;
    pDVar14->eRoot = (Dec_Edge_t)0x1;
    return pDVar14;
  }
  uVar19 = (ulong)uVar18;
  uVar13 = 0;
  while (pTruth[uVar13] == 0) {
    uVar13 = uVar13 + 1;
    if (uVar19 == uVar13) goto LAB_002ff1e6;
  }
  uVar13 = 0;
  do {
    if (pTruth[uVar13] != 0xffffffffffffffff) {
      iVar11 = clock_gettime(3,&local_58);
      if (iVar11 < 0) {
        lVar16 = 1;
      }
      else {
        lVar16 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_58.tv_nsec),8);
        lVar16 = ((lVar16 >> 7) - (lVar16 >> 0x3f)) + local_58.tv_sec * -1000000;
      }
      pGraph = Kit_TruthToGraph((uint *)pTruth,iVar12,p->vMemory);
      iVar12 = clock_gettime(3,&local_58);
      if (iVar12 < 0) {
        lVar17 = -1;
      }
      else {
        lVar17 = local_58.tv_nsec / 1000 + local_58.tv_sec * 1000000;
      }
      p->timeFact = p->timeFact + lVar17 + lVar16;
      iVar12 = vFanins->nSize;
      if (0 < (long)iVar12) {
        ppvVar7 = vFanins->pArray;
        lVar16 = 0;
        do {
          piVar15 = (int *)((long)ppvVar7[lVar16] + 0x2c);
          *piVar15 = *piVar15 + 1;
          lVar16 = lVar16 + 1;
        } while (iVar12 != lVar16);
      }
      pAVar8 = local_40->pNtk;
      if ((pAVar8->vTravIds).pArray == (int *)0x0) {
        iVar12 = pAVar8->vObjs->nSize;
        uVar13 = (long)iVar12 + 500;
        iVar11 = (int)uVar13;
        if ((pAVar8->vTravIds).nCap < iVar11) {
          piVar15 = (int *)malloc(uVar13 * 4);
          (pAVar8->vTravIds).pArray = piVar15;
          if (piVar15 == (int *)0x0) {
            __assert_fail("p->pArray",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                          ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
          }
          (pAVar8->vTravIds).nCap = iVar11;
        }
        else {
          piVar15 = (int *)0x0;
        }
        if (-500 < iVar12) {
          memset(piVar15,0,(uVar13 & 0xffffffff) << 2);
        }
        (pAVar8->vTravIds).nSize = iVar11;
      }
      iVar12 = pAVar8->nTravIds;
      pAVar8->nTravIds = iVar12 + 1;
      if (iVar12 < 0x3fffffff) {
        iVar12 = Abc_NodeMffcLabelAig(local_40);
        if (0 < vFanins->nSize) {
          lVar16 = 1;
          lVar17 = 0;
          do {
            pvVar9 = vFanins->pArray[lVar17];
            piVar15 = (int *)((long)pvVar9 + 0x2c);
            *piVar15 = *piVar15 + -1;
            *(void **)(&pGraph->pNodes->eEdge0 + lVar16 * 2) = pvVar9;
            lVar17 = lVar17 + 1;
            lVar16 = lVar16 + 3;
          } while (lVar17 < vFanins->nSize);
        }
        iVar11 = clock_gettime(3,&local_58);
        if (iVar11 < 0) {
          lVar16 = 1;
        }
        else {
          lVar16 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_58.tv_nsec),8);
          lVar16 = ((lVar16 >> 7) - (lVar16 >> 0x3f)) + local_58.tv_sec * -1000000;
        }
        iVar11 = Dec_GraphToNetworkCount(local_40,(Dec_Graph_t *)pGraph,iVar12,local_44);
        iVar10 = clock_gettime(3,&local_58);
        if (iVar10 < 0) {
          lVar17 = -1;
        }
        else {
          lVar17 = local_58.tv_nsec / 1000 + local_58.tv_sec * 1000000;
        }
        p->timeEval = p->timeEval + lVar17 + lVar16;
        if ((iVar11 != -1) && ((local_34 != 0 || (iVar12 != iVar11)))) {
          p->nLastGain = iVar12 - iVar11;
          uVar3 = p->nNodesRefactored;
          uVar6 = p->nNodesGained;
          p->nNodesRefactored = uVar3 + 1;
          p->nNodesGained = (iVar12 - iVar11) + uVar6;
          return (Dec_Graph_t *)pGraph;
        }
        if (pGraph->pNodes != (Kit_Node_t *)0x0) {
          free(pGraph->pNodes);
        }
        free(pGraph);
        return (Dec_Graph_t *)0x0;
      }
      __assert_fail("p->nTravIds < (1<<30)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abc.h"
                    ,0x198,"void Abc_NtkIncrementTravId(Abc_Ntk_t *)");
    }
    uVar13 = uVar13 + 1;
  } while (uVar19 != uVar13);
LAB_002ff1e6:
  iVar12 = Abc_NodeMffcSize(local_40);
  p->nLastGain = iVar12;
  uVar2 = p->nNodesRefactored;
  uVar5 = p->nNodesGained;
  p->nNodesRefactored = uVar2 + 1;
  p->nNodesGained = iVar12 + uVar5;
  if (0 < (int)uVar18) {
    uVar13 = 0;
    do {
      if (pTruth[uVar13] != 0) {
        pDVar14 = (Dec_Graph_t *)calloc(1,0x20);
        pDVar14->fConst = 1;
        return pDVar14;
      }
      uVar13 = uVar13 + 1;
    } while (uVar19 != uVar13);
  }
  goto LAB_002ff228;
}

Assistant:

Dec_Graph_t * Abc_NodeRefactor( Abc_ManRef_t * p, Abc_Obj_t * pNode, Vec_Ptr_t * vFanins, int fUpdateLevel, int fUseZeros, int fUseDcs, int fVerbose )
{
    extern int    Dec_GraphToNetworkCount( Abc_Obj_t * pRoot, Dec_Graph_t * pGraph, int NodeMax, int LevelMax );
    int fVeryVerbose = 0;
    int nVars = Vec_PtrSize(vFanins);
    int nWordsMax = Abc_Truth6WordNum(p->nNodeSizeMax);
    Dec_Graph_t * pFForm;
    Abc_Obj_t * pFanin;
    word * pTruth;
    abctime clk;
    int i, nNodesSaved, nNodesAdded, Required;

    p->nNodesConsidered++;

    Required = fUpdateLevel? Abc_ObjRequiredLevel(pNode) : ABC_INFINITY;

    // get the function of the cut
clk = Abc_Clock();
    pTruth = Abc_NodeConeTruth( p->vVars, p->vFuncs, nWordsMax, pNode, vFanins, p->vVisited );
p->timeTru += Abc_Clock() - clk;
    if ( pTruth == NULL )
        return NULL;

    // always accept the case of constant node
    if ( Abc_NodeConeIsConst0(pTruth, nVars) || Abc_NodeConeIsConst1(pTruth, nVars) )
    {
        p->nLastGain = Abc_NodeMffcSize( pNode );
        p->nNodesGained += p->nLastGain;
        p->nNodesRefactored++;
        return Abc_NodeConeIsConst0(pTruth, nVars) ? Dec_GraphCreateConst0() : Dec_GraphCreateConst1();
    }

    // get the factored form
clk = Abc_Clock();
    pFForm = (Dec_Graph_t *)Kit_TruthToGraph( (unsigned *)pTruth, nVars, p->vMemory );
p->timeFact += Abc_Clock() - clk;

    // mark the fanin boundary 
    // (can mark only essential fanins, belonging to bNodeFunc!)
    Vec_PtrForEachEntry( Abc_Obj_t *, vFanins, pFanin, i )
        pFanin->vFanouts.nSize++;
    // label MFFC with current traversal ID
    Abc_NtkIncrementTravId( pNode->pNtk );
    nNodesSaved = Abc_NodeMffcLabelAig( pNode );
    // unmark the fanin boundary and set the fanins as leaves in the form
    Vec_PtrForEachEntry( Abc_Obj_t *, vFanins, pFanin, i )
    {
        pFanin->vFanouts.nSize--;
        Dec_GraphNode(pFForm, i)->pFunc = pFanin;
    }

    // detect how many new nodes will be added (while taking into account reused nodes)
clk = Abc_Clock();
    nNodesAdded = Dec_GraphToNetworkCount( pNode, pFForm, nNodesSaved, Required );
p->timeEval += Abc_Clock() - clk;
    // quit if there is no improvement
    if ( nNodesAdded == -1 || (nNodesAdded == nNodesSaved && !fUseZeros) )
    {
        Dec_GraphFree( pFForm );
        return NULL;
    }

    // compute the total gain in the number of nodes
    p->nLastGain = nNodesSaved - nNodesAdded;
    p->nNodesGained += p->nLastGain;
    p->nNodesRefactored++;

    // report the progress
    if ( fVeryVerbose )
    {
        printf( "Node %6s : ",  Abc_ObjName(pNode) );
        printf( "Cone = %2d. ", vFanins->nSize );
        printf( "FF = %2d. ",   1 + Dec_GraphNodeNum(pFForm) );
        printf( "MFFC = %2d. ", nNodesSaved );
        printf( "Add = %2d. ",  nNodesAdded );
        printf( "GAIN = %2d. ", p->nLastGain );
        printf( "\n" );
    }
    return pFForm;
}